

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryLeakDetectorTest_OneLeakOutsideCheckingPeriod_Test::testBody
          (TEST_MemoryLeakDetectorTest_OneLeakOutsideCheckingPeriod_Test *this)

{
  MemoryLeakDetector *this_00;
  bool bVar1;
  TestMemoryAllocator *allocator;
  char *otherBuffer;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  SimpleString local_78;
  SimpleString local_68;
  SimpleString local_58;
  SimpleString local_48 [2];
  undefined1 local_28 [8];
  SimpleString output;
  char *mem;
  TEST_MemoryLeakDetectorTest_OneLeakOutsideCheckingPeriod_Test *this_local;
  
  MemoryLeakDetector::stopChecking
            ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector);
  this_00 = (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector;
  allocator = defaultNewAllocator();
  output.bufferSize_ = (size_t)MemoryLeakDetector::allocMemory(this_00,allocator,4,false);
  otherBuffer = MemoryLeakDetector::report
                          ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                           mem_leak_period_all);
  SimpleString::SimpleString((SimpleString *)local_28,otherBuffer);
  pUVar2 = UtestShell::getCurrent();
  SimpleString::SimpleString(local_48,"Memory leak(s) found");
  bVar1 = SimpleString::contains((SimpleString *)local_28,local_48);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","output.contains(\"Memory leak(s) found\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0xc9,pTVar3);
  SimpleString::~SimpleString(local_48);
  pUVar2 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_58,"size: 4");
  bVar1 = SimpleString::contains((SimpleString *)local_28,&local_58);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","output.contains(\"size: 4\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0xca,pTVar3);
  SimpleString::~SimpleString(&local_58);
  pUVar2 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_68,"new");
  bVar1 = SimpleString::contains((SimpleString *)local_28,&local_68);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","output.contains(\"new\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0xcb,pTVar3);
  SimpleString::~SimpleString(&local_68);
  pUVar2 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_78,"Total number of leaks");
  bVar1 = SimpleString::contains((SimpleString *)local_28,&local_78);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","output.contains(\"Total number of leaks\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0xcc,pTVar3);
  SimpleString::~SimpleString(&local_78);
  (*PlatformSpecificFree)((void *)output.bufferSize_);
  SimpleString::~SimpleString((SimpleString *)local_28);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, OneLeakOutsideCheckingPeriod)
{
    detector->stopChecking();
    char* mem = detector->allocMemory(defaultNewAllocator(), 4);
    SimpleString output = detector->report(mem_leak_period_all);
    CHECK(output.contains("Memory leak(s) found"));
    CHECK(output.contains("size: 4"));
    CHECK(output.contains("new"));
    CHECK(output.contains("Total number of leaks"));
    PlatformSpecificFree(mem);
}